

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

altsvc * altsvc_createid(char *srchost,size_t hlen,char *dsthost,size_t dlen,alpnid srcalpnid,
                        alpnid dstalpnid,size_t srcport,size_t dstport)

{
  altsvc *as;
  char *pcVar1;
  
  as = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (as == (altsvc *)0x0) {
    return (altsvc *)0x0;
  }
  if (dlen != 0 && hlen != 0) {
    if ((hlen < 3) || (*srchost != '[')) {
      if ((srchost[hlen - 1] == '.') && (hlen = hlen - 1, hlen == 0)) goto LAB_00111808;
    }
    else {
      srchost = srchost + 1;
      hlen = hlen - 2;
    }
    if ((2 < dlen) && (*dsthost == '[')) {
      dsthost = dsthost + 1;
      dlen = dlen - 2;
    }
    pcVar1 = (char *)Curl_memdup0(srchost,hlen);
    (as->src).host = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(dsthost,dlen);
      (as->dst).host = pcVar1;
      if (pcVar1 != (char *)0x0) {
        (as->src).alpnid = srcalpnid;
        (as->dst).alpnid = dstalpnid;
        (as->src).port = (unsigned_short)srcport;
        (as->dst).port = (unsigned_short)dstport;
        return as;
      }
    }
  }
LAB_00111808:
  altsvc_free(as);
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      size_t hlen,
                                      const char *dsthost,
                                      size_t dlen, /* dsthost length */
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      size_t srcport,
                                      size_t dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  if(!as)
    return NULL;
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen)
    /* bad input */
    goto error;
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.') {
    /* strip off trailing dot */
    hlen--;
    if(!hlen)
      goto error;
  }
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = (unsigned short)srcport;
  as->dst.port = (unsigned short)dstport;

  return as;
error:
  altsvc_free(as);
  return NULL;
}